

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O1

void __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,QDBusPlatformMenuItem *item,int depth,
          QStringList *propertyNames)

{
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  copy;
  undefined1 *local_48;
  QVariantMap QStack_40;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_id = (int)*(short *)&item->field_0x42;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_40.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  QDBusMenuItem::QDBusMenuItem((QDBusMenuItem *)&local_48,item);
  if (QStack_40.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)QStack_40.d.d.ptr = *(int *)QStack_40.d.d.ptr + 1;
    UNLOCK();
  }
  local_38.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
        )(this->m_properties).d.d.ptr;
  (this->m_properties).d.d.ptr =
       (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
        *)QStack_40.d.d.ptr;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38);
  if ((QDBusPlatformMenu *)item->m_subMenu != (QDBusPlatformMenu *)0x0 && depth != 0) {
    populate(this,(QDBusPlatformMenu *)item->m_subMenu,depth,propertyNames);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&QStack_40.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuLayoutItem::populate(const QDBusPlatformMenuItem *item, int depth, const QStringList &propertyNames)
{
    m_id = item->dbusID();
    QDBusMenuItem proxy(item);
    m_properties = proxy.m_properties;

    const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
    if (depth != 0 && menu)
        populate(menu, depth, propertyNames);
}